

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O1

void intgemm::AVX2::Kernels8::QuantizeU(float *input,uint8_t *output,float quant_mult,Index size)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar11 [64];
  
  if (size != 0) {
    auVar7[8] = 0x81;
    auVar7._0_8_ = 0x8181818181818181;
    auVar7[9] = 0x81;
    auVar7[10] = 0x81;
    auVar7[0xb] = 0x81;
    auVar7[0xc] = 0x81;
    auVar7[0xd] = 0x81;
    auVar7[0xe] = 0x81;
    auVar7[0xf] = 0x81;
    auVar7[0x10] = 0x81;
    auVar7[0x11] = 0x81;
    auVar7[0x12] = 0x81;
    auVar7[0x13] = 0x81;
    auVar7[0x14] = 0x81;
    auVar7[0x15] = 0x81;
    auVar7[0x16] = 0x81;
    auVar7[0x17] = 0x81;
    auVar7[0x18] = 0x81;
    auVar7[0x19] = 0x81;
    auVar7[0x1a] = 0x81;
    auVar7[0x1b] = 0x81;
    auVar7[0x1c] = 0x81;
    auVar7[0x1d] = 0x81;
    auVar7[0x1e] = 0x81;
    auVar7[0x1f] = 0x81;
    lVar6 = 0;
    auVar8[8] = 0x7f;
    auVar8._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar8[9] = 0x7f;
    auVar8[10] = 0x7f;
    auVar8[0xb] = 0x7f;
    auVar8[0xc] = 0x7f;
    auVar8[0xd] = 0x7f;
    auVar8[0xe] = 0x7f;
    auVar8[0xf] = 0x7f;
    auVar8[0x10] = 0x7f;
    auVar8[0x11] = 0x7f;
    auVar8[0x12] = 0x7f;
    auVar8[0x13] = 0x7f;
    auVar8[0x14] = 0x7f;
    auVar8[0x15] = 0x7f;
    auVar8[0x16] = 0x7f;
    auVar8[0x17] = 0x7f;
    auVar8[0x18] = 0x7f;
    auVar8[0x19] = 0x7f;
    auVar8[0x1a] = 0x7f;
    auVar8[0x1b] = 0x7f;
    auVar8[0x1c] = 0x7f;
    auVar8[0x1d] = 0x7f;
    auVar8[0x1e] = 0x7f;
    auVar8[0x1f] = 0x7f;
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    do {
      pfVar1 = input + lVar6;
      auVar9._0_4_ = quant_mult * *pfVar1;
      auVar9._4_4_ = quant_mult * pfVar1[1];
      auVar9._8_4_ = quant_mult * pfVar1[2];
      auVar9._12_4_ = quant_mult * pfVar1[3];
      auVar9._16_4_ = quant_mult * pfVar1[4];
      auVar9._20_4_ = quant_mult * pfVar1[5];
      auVar9._28_36_ = in_ZMM4._28_36_;
      auVar9._24_4_ = quant_mult * pfVar1[6];
      auVar2 = vcvtps2dq_avx(auVar9._0_32_);
      auVar10._0_4_ = quant_mult * pfVar1[8];
      auVar10._4_4_ = quant_mult * pfVar1[9];
      auVar10._8_4_ = quant_mult * pfVar1[10];
      auVar10._12_4_ = quant_mult * pfVar1[0xb];
      auVar10._16_4_ = quant_mult * pfVar1[0xc];
      auVar10._20_4_ = quant_mult * pfVar1[0xd];
      auVar10._28_36_ = in_ZMM5._28_36_;
      auVar10._24_4_ = quant_mult * pfVar1[0xe];
      auVar3 = vcvtps2dq_avx(auVar10._0_32_);
      auVar4 = vpackssdw_avx2(auVar2,auVar3);
      auVar2._4_4_ = quant_mult * pfVar1[0x11];
      auVar2._0_4_ = quant_mult * pfVar1[0x10];
      auVar2._8_4_ = quant_mult * pfVar1[0x12];
      auVar2._12_4_ = quant_mult * pfVar1[0x13];
      auVar2._16_4_ = quant_mult * pfVar1[0x14];
      auVar2._20_4_ = quant_mult * pfVar1[0x15];
      auVar2._24_4_ = quant_mult * pfVar1[0x16];
      auVar2._28_4_ = auVar3._28_4_;
      auVar2 = vcvtps2dq_avx(auVar2);
      auVar11._0_4_ = quant_mult * pfVar1[0x18];
      auVar11._4_4_ = quant_mult * pfVar1[0x19];
      auVar11._8_4_ = quant_mult * pfVar1[0x1a];
      auVar11._12_4_ = quant_mult * pfVar1[0x1b];
      auVar11._16_4_ = quant_mult * pfVar1[0x1c];
      auVar11._20_4_ = quant_mult * pfVar1[0x1d];
      auVar11._28_36_ = in_ZMM6._28_36_;
      auVar11._24_4_ = quant_mult * pfVar1[0x1e];
      auVar3 = vcvtps2dq_avx(auVar11._0_32_);
      in_ZMM6 = ZEXT3264(auVar3);
      auVar2 = vpackssdw_avx2(auVar2,auVar3);
      in_ZMM5 = ZEXT3264(auVar2);
      auVar2 = vpacksswb_avx2(auVar4,auVar2);
      auVar2 = vpmaxsb_avx2(auVar2,auVar7);
      auVar2 = vpaddb_avx2(auVar2,auVar8);
      auVar2 = vpermd_avx2(auVar5,auVar2);
      in_ZMM4 = ZEXT3264(auVar2);
      *(undefined1 (*) [32])(output + lVar6) = auVar2;
      lVar6 = lVar6 + 0x20;
    } while (pfVar1 + 0x20 != input + size);
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void QuantizeU(const float *input, uint8_t *output, float quant_mult, Index size) {
    assert(size % 32 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 32 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 32, output += 32) {
      *reinterpret_cast<__m256i*>(output) = QuantizeTile8::ConsecutiveU(q, input);
    }
  }